

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O0

void verifyOrthonormal<Imath_3_2::Matrix44<double>>
               (Matrix44<double> *A,BaseType_conflict3 threshold)

{
  uint uVar1;
  uint uVar2;
  Matrix44<double> *in_RDI;
  Matrix44<double> *pMVar3;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  uint j;
  uint i;
  Matrix44<double> prod;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  uint uVar4;
  uint i_00;
  Matrix44<double> *in_stack_ffffffffffffff18;
  Matrix44<double> local_90;
  double local_10;
  
  local_10 = in_XMM0_Qa;
  Imath_3_2::Matrix44<double>::transposed(in_stack_ffffffffffffff18);
  Imath_3_2::Matrix44<double>::operator*
            ((Matrix44<double> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             in_RDI);
  uVar4 = 0;
  do {
    i_00 = uVar4;
    uVar1 = Imath_3_2::Matrix44<double>::dimensions();
    if (uVar1 <= uVar4) {
      return;
    }
    uVar4 = 0;
    while (uVar1 = uVar4, uVar2 = Imath_3_2::Matrix44<double>::dimensions(), uVar4 < uVar2) {
      if (i_00 == uVar1) {
        pMVar3 = &local_90;
        Imath_3_2::Matrix44<double>::operator[](pMVar3,i_00);
        std::abs((int)pMVar3);
        if (local_10 <= extraout_XMM0_Qa) {
          __assert_fail("std::abs (prod[i][j] - 1) < threshold",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                        ,0x3c,
                        "void verifyOrthonormal(const TM &, const typename TM::BaseType) [TM = Imath_3_2::Matrix44<double>]"
                       );
        }
      }
      else {
        pMVar3 = &local_90;
        Imath_3_2::Matrix44<double>::operator[](pMVar3,i_00);
        std::abs((int)pMVar3);
        if (local_10 <= extraout_XMM0_Qa_00) {
          __assert_fail("std::abs (prod[i][j]) < threshold",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                        ,0x3e,
                        "void verifyOrthonormal(const TM &, const typename TM::BaseType) [TM = Imath_3_2::Matrix44<double>]"
                       );
        }
      }
      uVar4 = uVar1 + 1;
    }
    uVar4 = i_00 + 1;
  } while( true );
}

Assistant:

void
verifyOrthonormal (const TM& A, const typename TM::BaseType threshold)
{
    const TM prod = A * A.transposed ();
    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            if (i == j)
                assert (std::abs (prod[i][j] - 1) < threshold);
            else
                assert (std::abs (prod[i][j]) < threshold);
}